

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O2

qsizetype __thiscall
QtPrivate::lastIndexOf(QtPrivate *this,QByteArrayView haystack,qsizetype from,uchar needle)

{
  QtPrivate *pQVar1;
  void *pvVar2;
  QtPrivate *pQVar3;
  void *s;
  
  pQVar3 = (QtPrivate *)haystack.m_data;
  s = (void *)haystack.m_size;
  if ((long)pQVar3 < 0) {
    pQVar1 = (QtPrivate *)0x0;
    if (0 < (long)(pQVar3 + (long)this)) {
      pQVar1 = pQVar3 + (long)this;
    }
  }
  else {
    pQVar1 = this + -1;
    if ((long)pQVar3 <= (long)(this + -1)) {
      pQVar1 = pQVar3;
    }
  }
  if (s == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = qmemrchr(s,(uint)from & 0xff,(size_t)(pQVar1 + 1));
  }
  return -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)s;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack, qsizetype from, uchar needle) noexcept
{
    if (from < 0)
        from = qMax(from + haystack.size(), qsizetype(0));
    else
        from = qMin(from, haystack.size() - 1);

    const char *const b = haystack.data();
    const void *n = b ? qmemrchr(b, needle, from + 1) : nullptr;
    return n ? static_cast<const char *>(n) - b : -1;
}